

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUnate.c
# Opt level: O3

void Abc_NtkPrintUnate(Abc_Ntk_t *pNtk,int fUseBdds,int fUseNaive,int fVerbose)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  DdManager *dd;
  void *pvVar5;
  undefined8 uVar6;
  Extra_UnateInfo_t *pEVar7;
  Vec_Ptr_t *pVVar8;
  DdNode *pDVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  timespec ts;
  timespec local_60;
  long local_50;
  long local_48;
  Abc_Ntk_t *local_40;
  DdManager *local_38;
  
  if (fUseBdds != 0 || fUseNaive != 0) {
    iVar2 = clock_gettime(3,&local_60);
    if (iVar2 < 0) {
      local_50 = -1;
    }
    else {
      local_50 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
    }
    dd = (DdManager *)Abc_NtkBuildGlobalBdds(pNtk,10000000,1,1,0,fVerbose);
    if (dd != (DdManager *)0x0) {
      iVar2 = clock_gettime(3,&local_60);
      if (iVar2 < 0) {
        local_48 = -1;
      }
      else {
        local_48 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
      }
      uVar3 = Cudd_ReadKeys(dd);
      uVar4 = Cudd_ReadDead(dd);
      uVar12 = 0;
      printf("Shared BDD size = %6d nodes.\n",(ulong)(uVar3 - uVar4));
      local_40 = pNtk;
      local_38 = dd;
      if (fUseNaive == 0) {
        Cudd_zddVarsFromBddVars(dd,2);
        pVVar8 = pNtk->vCos;
        uVar3 = 0;
        if (0 < pVVar8->nSize) {
          uVar15 = 0;
          uVar12 = 0;
          do {
            lVar13 = *(long *)(*pVVar8->pArray[uVar15] + 0x1b0);
            if (*(int *)(lVar13 + 4) < 8) goto LAB_0031dbeb;
            piVar1 = *(int **)(*(long *)(lVar13 + 8) + 0x38);
            pvVar5 = *(void **)(piVar1 + 2);
            if (pvVar5 == (void *)0x0) goto LAB_0031dbcc;
            iVar2 = (int)*(long *)((long)pVVar8->pArray[uVar15] + 0x10);
            lVar13 = (long)iVar2;
            iVar10 = *piVar1;
            if (iVar10 <= iVar2) {
              iVar17 = iVar2 + 10;
              if (iVar2 < iVar10 * 2) {
                iVar17 = iVar10 * 2;
              }
              if (iVar10 < iVar17) {
                pvVar5 = realloc(pvVar5,(long)iVar17 * 8);
                pNtk = local_40;
                *(void **)(piVar1 + 2) = pvVar5;
                memset((void *)((long)pvVar5 + (long)*piVar1 * 8),0,
                       ((long)iVar17 - (long)*piVar1) * 8);
                *piVar1 = iVar17;
              }
            }
            pDVar9 = *(DdNode **)((long)pvVar5 + lVar13 * 8);
            if (pDVar9 == (DdNode *)0x0) {
              if (*(code **)(piVar1 + 8) == (code *)0x0) {
                pDVar9 = (DdNode *)0x0;
              }
              else {
                uVar6 = (**(code **)(piVar1 + 8))(*(undefined8 *)(piVar1 + 4));
                *(undefined8 *)(*(long *)(piVar1 + 2) + lVar13 * 8) = uVar6;
                pDVar9 = *(DdNode **)(*(long *)(piVar1 + 2) + lVar13 * 8);
              }
            }
            pEVar7 = Extra_UnateComputeFast(local_38,pDVar9);
            if (fVerbose != 0) {
              printf("Out%4d : ",uVar15 & 0xffffffff);
              Extra_UnateInfoPrint(pEVar7);
            }
            uVar3 = uVar3 + pEVar7->nVars;
            uVar12 = uVar12 + pEVar7->nUnate;
            Extra_UnateInfoDissolve(pEVar7);
            uVar15 = uVar15 + 1;
            pVVar8 = pNtk->vCos;
          } while ((long)uVar15 < (long)pVVar8->nSize);
        }
      }
      else {
        pVVar8 = pNtk->vCos;
        uVar3 = 0;
        uVar12 = 0;
        if (0 < pVVar8->nSize) {
          uVar15 = 0;
          uVar3 = 0;
          uVar12 = 0;
          do {
            lVar13 = *(long *)(*pVVar8->pArray[uVar15] + 0x1b0);
            if (*(int *)(lVar13 + 4) < 8) {
LAB_0031dbeb:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            piVar1 = *(int **)(*(long *)(lVar13 + 8) + 0x38);
            pvVar5 = *(void **)(piVar1 + 2);
            if (pvVar5 == (void *)0x0) {
LAB_0031dbcc:
              __assert_fail("p->pArrayPtr",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecAtt.h"
                            ,0xf9,"void *Vec_AttEntry(Vec_Att_t *, int)");
            }
            iVar2 = (int)*(long *)((long)pVVar8->pArray[uVar15] + 0x10);
            lVar13 = (long)iVar2;
            iVar10 = *piVar1;
            if (iVar10 <= iVar2) {
              iVar17 = iVar2 + 10;
              if (iVar2 < iVar10 * 2) {
                iVar17 = iVar10 * 2;
              }
              if (iVar10 < iVar17) {
                pvVar5 = realloc(pvVar5,(long)iVar17 * 8);
                pNtk = local_40;
                *(void **)(piVar1 + 2) = pvVar5;
                memset((void *)((long)pvVar5 + (long)*piVar1 * 8),0,
                       ((long)iVar17 - (long)*piVar1) * 8);
                *piVar1 = iVar17;
              }
            }
            pDVar9 = *(DdNode **)((long)pvVar5 + lVar13 * 8);
            if (pDVar9 == (DdNode *)0x0) {
              if (*(code **)(piVar1 + 8) == (code *)0x0) {
                pDVar9 = (DdNode *)0x0;
              }
              else {
                uVar6 = (**(code **)(piVar1 + 8))(*(undefined8 *)(piVar1 + 4));
                *(undefined8 *)(*(long *)(piVar1 + 2) + lVar13 * 8) = uVar6;
                pDVar9 = *(DdNode **)(*(long *)(piVar1 + 2) + lVar13 * 8);
              }
            }
            pEVar7 = Extra_UnateComputeSlow(local_38,pDVar9);
            if (fVerbose != 0) {
              printf("Out%4d : ",uVar15 & 0xffffffff);
              Extra_UnateInfoPrint(pEVar7);
            }
            uVar3 = uVar3 + pEVar7->nVars;
            uVar12 = uVar12 + pEVar7->nUnate;
            Extra_UnateInfoDissolve(pEVar7);
            uVar15 = uVar15 + 1;
            pVVar8 = pNtk->vCos;
          } while ((long)uVar15 < (long)pVVar8->nSize);
        }
      }
      lVar13 = local_48;
      lVar14 = local_48 - local_50;
      iVar2 = clock_gettime(3,&local_60);
      lVar16 = -1;
      lVar11 = -1;
      if (-1 < iVar2) {
        lVar11 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
      }
      iVar2 = 0x992534;
      printf("Ins/Outs = %4d/%4d.  Total supp = %5d.  Total unate = %5d.\n",
             (ulong)(uint)pNtk->vCis->nSize,(ulong)(uint)pNtk->vCos->nSize,(ulong)uVar3,
             (ulong)uVar12);
      Abc_Print(iVar2,"%s =","Glob BDDs");
      Abc_Print(iVar2,"%9.2f sec\n",(double)lVar14 / 1000000.0);
      Abc_Print(iVar2,"%s =","Unateness");
      Abc_Print(iVar2,"%9.2f sec\n",(double)(lVar11 - lVar13) / 1000000.0);
      Abc_Print(iVar2,"%s =","Total    ");
      iVar10 = 3;
      iVar2 = clock_gettime(3,&local_60);
      if (-1 < iVar2) {
        lVar16 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
      }
      Abc_Print(iVar10,"%9.2f sec\n",(double)(lVar16 - local_50) / 1000000.0);
      Abc_NtkFreeGlobalBdds(pNtk,1);
    }
  }
  return;
}

Assistant:

void Abc_NtkPrintUnate( Abc_Ntk_t * pNtk, int fUseBdds, int fUseNaive, int fVerbose )
{
    if ( fUseBdds || fUseNaive )
        Abc_NtkPrintUnateBdd( pNtk, fUseNaive, fVerbose );
    else
        Abc_NtkPrintUnateSat( pNtk, fVerbose );
}